

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

CharPtr __thiscall
fmt::BasicWriter<char>::
prepare_int_buffer<fmt::IntFormatSpec<unsigned_long,fmt::TypeSpec<(char)0>,char>>
          (BasicWriter<char> *this,uint num_digits,
          IntFormatSpec<unsigned_long,_fmt::TypeSpec<__x00_>,_char> *spec,char *prefix,
          uint prefix_size)

{
  ulong uVar1;
  Buffer<char> *pBVar2;
  size_t sVar3;
  CharPtr pcVar4;
  char *__dest;
  AlignSpec subspec;
  AlignSpec local_3c;
  
  if ((int)num_digits < -1) {
    if (prefix_size == 0) {
      prefix_size = 0;
    }
    else if (prefix[prefix_size - 1] == '0') {
      prefix_size = prefix_size - 1;
    }
    local_3c.super_WidthSpec.width_ = prefix_size - 1;
    local_3c.super_WidthSpec.fill_ = L'0';
    local_3c.align_ = ALIGN_NUMERIC;
    pcVar4 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_3c,prefix,prefix_size);
  }
  else {
    pBVar2 = this->buffer_;
    sVar3 = pBVar2->size_;
    uVar1 = (num_digits + prefix_size) + sVar3;
    if (pBVar2->capacity_ < uVar1) {
      (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    }
    pBVar2->size_ = uVar1;
    __dest = this->buffer_->ptr_ + sVar3;
    if (prefix_size != 0) {
      memmove(__dest,prefix,(ulong)prefix_size);
    }
    pcVar4 = __dest + ((ulong)(num_digits + prefix_size) - 1);
  }
  return pcVar4;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec,
    const char *prefix, unsigned prefix_size) {
  unsigned width = spec.width();
  Alignment align = spec.align();
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  if (spec.precision() > static_cast<int>(num_digits)) {
    // Octal prefix '0' is counted as a digit, so ignore it if precision
    // is specified.
    if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
      --prefix_size;
    unsigned number_size =
        prefix_size + internal::to_unsigned(spec.precision());
    AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
    if (number_size >= width)
      return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
    buffer_.reserve(width);
    unsigned fill_size = width - number_size;
    if (align != ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    CharPtr result = prepare_int_buffer(
        num_digits, subspec, prefix, prefix_size);
    if (align == ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    return result;
  }
  unsigned size = prefix_size + num_digits;
  if (width <= size) {
    CharPtr p = grow_buffer(size);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    return p + size - 1;
  }
  CharPtr p = grow_buffer(width);
  CharPtr end = p + width;
  if (align == ALIGN_LEFT) {
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
    std::uninitialized_fill(p, end, fill);
  } else if (align == ALIGN_CENTER) {
    p = fill_padding(p, width, size, fill);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
  } else {
    if (align == ALIGN_NUMERIC) {
      if (prefix_size != 0) {
        p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
        size -= prefix_size;
      }
    } else {
      std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
    }
    std::uninitialized_fill(p, end - size, fill);
    p = end;
  }
  return p - 1;
}